

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O3

int __thiscall
anon_unknown.dwarf_38a::NinjaMain::ToolGraph(NinjaMain *this,Options *options,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  pointer ppNVar3;
  vector<Node_*,_std::allocator<Node_*>_> nodes;
  string err;
  GraphViz graph;
  vector<Node_*,_std::allocator<Node_*>_> local_c8;
  string local_a8;
  GraphViz local_88;
  
  local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  bVar1 = CollectTargetsFromArgs(this,argc,argv,&local_c8,&local_a8);
  if (bVar1) {
    local_88.dyndep_loader_.state_ = &this->state_;
    local_88.dyndep_loader_.disk_interface_ = &(this->disk_interface_).super_DiskInterface;
    local_88.visited_nodes_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_88.visited_nodes_._M_t._M_impl.super__Rb_tree_header._M_header;
    local_88.visited_nodes_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_88.visited_nodes_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_88.visited_nodes_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_88.visited_edges_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_88.visited_edges_._M_t._M_impl.super__Rb_tree_header._M_header;
    local_88.visited_edges_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_88.visited_edges_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_88.visited_edges_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_88.visited_nodes_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_88.visited_nodes_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_88.visited_edges_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_88.visited_edges_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    GraphViz::Start(&local_88);
    if (local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_start !=
        local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      ppNVar3 = local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        GraphViz::AddTarget(&local_88,*ppNVar3);
        ppNVar3 = ppNVar3 + 1;
      } while (ppNVar3 !=
               local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    GraphViz::Finish(&local_88);
    std::
    _Rb_tree<Edge_*,_Edge_*,_std::_Identity<Edge_*>,_std::less<Edge_*>,_std::allocator<Edge_*>_>::
    ~_Rb_tree(&local_88.visited_edges_._M_t);
    std::
    _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>::
    ~_Rb_tree(&local_88.visited_nodes_._M_t);
    iVar2 = 0;
  }
  else {
    iVar2 = 1;
    Error("%s",local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  if (local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar2;
}

Assistant:

int NinjaMain::ToolGraph(const Options* options, int argc, char* argv[]) {
  vector<Node*> nodes;
  string err;
  if (!CollectTargetsFromArgs(argc, argv, &nodes, &err)) {
    Error("%s", err.c_str());
    return 1;
  }

  GraphViz graph(&state_, &disk_interface_);
  graph.Start();
  for (vector<Node*>::const_iterator n = nodes.begin(); n != nodes.end(); ++n)
    graph.AddTarget(*n);
  graph.Finish();

  return 0;
}